

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-inequalities-101.cpp
# Opt level: O2

bool __thiscall
baryonyx::itm::
solver_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,false>
::
push_and_compute_update_row<baryonyx::bit_array,std::reverse_iterator<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>>
          (solver_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,false>
           *this,bit_array *x,
          reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
          *first,reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
                 *last,double kappa,double delta,double theta,double obj_amp)

{
  undefined1 auVar1 [16];
  int k;
  rc_data *begin;
  long lVar2;
  bool bVar3;
  int selected;
  int *piVar4;
  long lVar5;
  bool bVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  tuple<baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*> it;
  rc_size sizes;
  undefined1 local_70 [16];
  rc_size local_60;
  solver_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,false>
  *local_58;
  __uniq_ptr_impl<baryonyx::sparse_matrix<int>::row_value,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
  local_50;
  double local_48;
  _Head_base<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_false> local_40;
  double local_38;
  
  local_58 = this + 0x10;
  bVar6 = false;
  piVar4 = (first->current)._M_current;
  local_50._M_t.
  super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
  .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>._M_head_impl =
       (tuple<baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
        )(tuple<baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
          )kappa;
  local_48 = delta;
  local_40._M_head_impl = (col_value *)theta;
  local_38 = obj_amp;
  while( true ) {
    if (piVar4 == (last->current)._M_current) {
      return bVar6;
    }
    k = piVar4[-1];
    if (*(int *)(this + 0x88) <= k) break;
    sparse_matrix<int>::row((sparse_matrix<int> *)local_70,(int)local_58);
    solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_false>
    ::decrease_preference
              ((solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_false>
                *)this,(row_iterator)local_70._8_8_,(row_iterator)local_70._0_8_,
               (double)local_40._M_head_impl);
    local_60 = solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_false>
               ::compute_reduced_costs<baryonyx::bit_array>
                         ((solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_false>
                           *)this,(row_iterator)local_70._8_8_,(row_iterator)local_70._0_8_,x);
    auVar8._8_8_ = 0;
    auVar8._0_8_ = local_38;
    begin = *(rc_data **)(this + 0x68);
    lVar2 = *(long *)(this + 0x80);
    for (lVar5 = 0; ((ulong)local_60 & 0xffffffff) << 4 != lVar5; lVar5 = lVar5 + 0x10) {
      auVar7._8_8_ = 0;
      auVar7._0_8_ = *(ulong *)(*(long *)(lVar2 + 8) +
                               (long)((row_iterator)
                                     (local_70._8_8_ + (long)*(int *)((long)&begin->id + lVar5) * 8)
                                     )->column * 8);
      auVar1._8_8_ = 0;
      auVar1._0_8_ = *(ulong *)((long)&begin->value + lVar5);
      auVar1 = vfmadd213sd_fma(auVar7,auVar8,auVar1);
      *(long *)((long)&begin->value + lVar5) = auVar1._0_8_;
    }
    calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*>
              (begin,begin + local_60.r_size,*(random_engine **)(this + 8));
    selected = solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_false>
               ::select_variables((solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_false>
                                   *)this,&local_60,*(int *)(*(long *)(this + 0x70) + (long)k * 0xc)
                                  ,*(int *)(*(long *)(this + 0x70) + 4 + (long)k * 0xc));
    bVar3 = affect<baryonyx::itm::solver_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,false>,baryonyx::bit_array,baryonyx::sparse_matrix<int>::row_value*,double>
                      ((solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_false>
                        *)this,x,(row_value *)local_70._8_8_,k,selected,local_60.r_size,
                       (double)local_50._M_t.
                               super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
                               .
                               super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>
                               ._M_head_impl,local_48);
    bVar6 = (bool)(bVar6 | bVar3);
    piVar4 = (first->current)._M_current + -1;
    (first->current)._M_current = piVar4;
  }
  details::fail_fast("Precondition","k < m",
                     "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/itm-solver-inequalities-101.cpp"
                     ,"266");
}

Assistant:

bool push_and_compute_update_row(Xtype& x,
                                     Iterator first,
                                     Iterator last,
                                     Float kappa,
                                     Float delta,
                                     Float theta,
                                     Float obj_amp)
    {
        auto at_least_one_pi_changed{ false };

        logger::log("push-update-row {} {} {}\n", kappa, delta, theta);

        for (; first != last; ++first) {
            auto k = constraint(first);

            bx_expects(k < m);

            const auto it = ap.row(k);
            decrease_preference(std::get<0>(it), std::get<1>(it), theta);

            const auto sizes =
              compute_reduced_costs(std::get<0>(it), std::get<1>(it), x);

            for (int i = 0; i != sizes.r_size; ++i)
                R[i].value +=
                  obj_amp * c((std::get<0>(it) + R[i].id)->column, x);

            calculator_sort<Mode>(R.get(), R.get() + sizes.r_size, rng);
            int selected = select_variables(sizes, b[k].min, b[k].max);

            logger::log("constraints {}: {} <= ", k, b[k].min);

            for (int i = 0; i < sizes.r_size; ++i)
                logger::log("{} ({} {}) ", R[i].f, R[i].value, R[i].id);

            logger::log("<= {} => Selected: {}\n", b[k].max, selected);

            auto pi_change = affect(*this,
                                    x,
                                    std::get<0>(it),
                                    k,
                                    selected,
                                    sizes.r_size,
                                    kappa,
                                    delta);

            at_least_one_pi_changed = at_least_one_pi_changed || pi_change;
        }

        return at_least_one_pi_changed;
    }